

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O1

void __thiscall OpenMesh::ArrayKernel::~ArrayKernel(ArrayKernel *this)

{
  pointer puVar1;
  pointer pFVar2;
  pointer pEVar3;
  pointer pVVar4;
  
  (this->super_BaseKernel)._vptr_BaseKernel = (_func_int **)&PTR__ArrayKernel_001c3a98;
  clear(this);
  puVar1 = (this->face_bit_masks_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->vertex_bit_masks_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->edge_bit_masks_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->halfedge_bit_masks_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pFVar2 = (this->faces_).
           super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2);
  }
  pEVar3 = (this->edges_).
           super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pEVar3 != (pointer)0x0) {
    operator_delete(pEVar3);
  }
  pVVar4 = (this->vertices_).
           super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar4 != (pointer)0x0) {
    operator_delete(pVVar4);
  }
  BaseKernel::~BaseKernel(&this->super_BaseKernel);
  return;
}

Assistant:

ArrayKernel::~ArrayKernel()
{
  clear();
}